

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatString.hpp
# Opt level: O3

void Diligent::
     FormatStrSS<std::__cxx11::stringstream,char[24],std::__cxx11::string,char[37],char_const*,char[69]>
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *ss,
               char (*FirstArg) [24],
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *RestArgs,
               char (*RestArgs_1) [37],char **RestArgs_2,char (*RestArgs_3) [69])

{
  size_t sVar1;
  
  sVar1 = strlen(*FirstArg);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)(ss + 0x10),*FirstArg,sVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(ss + 0x10),(RestArgs->_M_dataplus)._M_p,RestArgs->_M_string_length);
  FormatStrSS<std::__cxx11::stringstream,char[37],char_const*,char[69]>
            (ss,RestArgs_1,RestArgs_2,RestArgs_3);
  return;
}

Assistant:

void FormatStrSS(SSType& ss, const FirstArgType& FirstArg, const RestArgsType&... RestArgs)
{
    FormatStrSS(ss, FirstArg);
    FormatStrSS(ss, RestArgs...); // recursive call using pack expansion syntax
}